

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O2

bool __thiscall pg::SPMSolver::pm_less(SPMSolver *this,int *a,int *b,int d,int pl)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  uVar3 = (ulong)pl;
  if (a[uVar3] != -1) {
    if (b[uVar3] == -1) {
      return true;
    }
    uVar5 = (uint)this->k;
    iVar6 = -1;
    if ((uVar5 & 1) == uVar3) {
      iVar6 = -2;
    }
    lVar2 = (long)(int)(iVar6 + uVar5);
    while (lVar4 = lVar2, d <= lVar4) {
      iVar6 = a[lVar4];
      iVar1 = b[lVar4];
      lVar2 = lVar4 + -2;
      if (iVar6 != iVar1) {
        return iVar6 < iVar1 && (iVar1 <= this->counts[lVar4] || iVar6 <= this->counts[lVar4]);
      }
    }
  }
  return false;
}

Assistant:

bool
SPMSolver::pm_less(int* a, int* b, int d, int pl)
{
    // cases where a or b is Top
    if (a[pl] == -1) return false;
    if (b[pl] == -1) return true;
    // normal comparison, start with highest priority
    const int start = ((k&1) == pl) ? k-2 : k-1;
    for (int i=start; i>=d; i-=2) {
        if (a[i] == b[i]) continue;
        if (a[i] > counts[i] and b[i] > counts[i]) return false;
        return a[i] < b[i];
    }
    return false;
}